

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionFactory.cpp
# Opt level: O2

Session * __thiscall
FIX::SessionFactory::create(SessionFactory *this,SessionID *sessionID,Dictionary *settings)

{
  Application *application;
  MessageStoreFactory *messageStoreFactory;
  int64_t iVar1;
  int64_t iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  undefined7 extraout_var;
  Session *this_00;
  ConfigError *pCVar14;
  TimeRange *pTVar15;
  undefined1 local_7b8 [48];
  uint local_788;
  uint local_784;
  string local_780;
  undefined4 local_760;
  allocator<char> local_759;
  HeartBtInt heartBtInt;
  TimeRange utcLogonTime;
  TimeRange localLogonTime;
  UtcTimeOnly endTime;
  UtcTimeOnly startTime;
  DateTime local_608;
  DateTime local_5f0;
  string connectionType;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  string defaultApplVerID;
  TimeRange local_578;
  TimeRange utcSessionTime;
  string local_4d0;
  TimeRange localSessionTime;
  DataDictionaryProvider dataDictionaryProvider;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dataDictionaryProvider,"ConnectionType",(allocator<char> *)&heartBtInt);
  Dictionary::getString(&connectionType,settings,(string *)&dataDictionaryProvider,false);
  std::__cxx11::string::~string((string *)&dataDictionaryProvider);
  bVar8 = std::operator!=(&connectionType,"acceptor");
  if (bVar8) {
    bVar8 = std::operator!=(&connectionType,"initiator");
    if (bVar8) {
      pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataDictionaryProvider,"Invalid ConnectionType",
                 (allocator<char> *)&heartBtInt);
      ConfigError::ConfigError(pCVar14,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
    }
  }
  bVar8 = std::operator==(&connectionType,"acceptor");
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dataDictionaryProvider,"SessionQualifier",(allocator<char> *)&heartBtInt);
    bVar8 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
    std::__cxx11::string::~string((string *)&dataDictionaryProvider);
    if (bVar8) {
      pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataDictionaryProvider,"SessionQualifier cannot be used with acceptor.",
                 (allocator<char> *)&heartBtInt);
      ConfigError::ConfigError(pCVar14,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dataDictionaryProvider,"UseDataDictionary",(allocator<char> *)&heartBtInt);
  bVar8 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
  std::__cxx11::string::~string((string *)&dataDictionaryProvider);
  bVar9 = true;
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dataDictionaryProvider,"UseDataDictionary",(allocator<char> *)&heartBtInt)
    ;
    bVar9 = Dictionary::getBool(settings,(string *)&dataDictionaryProvider);
    std::__cxx11::string::~string((string *)&dataDictionaryProvider);
  }
  defaultApplVerID._M_dataplus._M_p = (pointer)&defaultApplVerID.field_2;
  defaultApplVerID._M_string_length = 0;
  defaultApplVerID.field_2._M_local_buf[0] = '\0';
  if (sessionID->m_isFIXT == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dataDictionaryProvider,"DefaultApplVerID",(allocator<char> *)&heartBtInt);
    bVar8 = Dictionary::has(settings,(string *)&dataDictionaryProvider);
    std::__cxx11::string::~string((string *)&dataDictionaryProvider);
    if (!bVar8) {
      pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dataDictionaryProvider,"ApplVerID is required for FIXT transport",
                 (allocator<char> *)&heartBtInt);
      ConfigError::ConfigError(pCVar14,(string *)&dataDictionaryProvider);
      __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&utcSessionTime,"DefaultApplVerID",(allocator<char> *)&localSessionTime);
    Dictionary::getString((string *)&utcLogonTime,settings,(string *)&utcSessionTime,false);
    BeginString::BeginString((BeginString *)&heartBtInt,(STRING *)&utcLogonTime);
    Message::toApplVerID((ApplVerID *)&dataDictionaryProvider,(BeginString *)&heartBtInt);
    std::__cxx11::string::_M_assign((string *)&defaultApplVerID);
    FieldBase::~FieldBase((FieldBase *)&dataDictionaryProvider);
    FieldBase::~FieldBase((FieldBase *)&heartBtInt);
    std::__cxx11::string::~string((string *)&utcLogonTime);
    std::__cxx11::string::~string((string *)&utcSessionTime);
  }
  DataDictionaryProvider::DataDictionaryProvider(&dataDictionaryProvider);
  if (bVar9 != false) {
    if (sessionID->m_isFIXT == true) {
      processFixtDataDictionaries(this,sessionID,settings,&dataDictionaryProvider);
    }
    else {
      processFixDataDictionary(this,sessionID,settings,&dataDictionaryProvider);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&heartBtInt,"UseLocalTime",(allocator<char> *)&utcLogonTime);
  bVar8 = Dictionary::has(settings,(string *)&heartBtInt);
  std::__cxx11::string::~string((string *)&heartBtInt);
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&heartBtInt,"UseLocalTime",(allocator<char> *)&utcLogonTime);
    bVar8 = Dictionary::getBool(settings,(string *)&heartBtInt);
    local_760 = (undefined4)CONCAT71(extraout_var,bVar8);
    std::__cxx11::string::~string((string *)&heartBtInt);
  }
  else {
    local_760 = 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&heartBtInt,"NonStopSession",(allocator<char> *)&utcLogonTime);
  bVar8 = Dictionary::has(settings,(string *)&heartBtInt);
  std::__cxx11::string::~string((string *)&heartBtInt);
  if (bVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&heartBtInt,"NonStopSession",(allocator<char> *)&utcLogonTime);
    bVar8 = Dictionary::getBool(settings,(string *)&heartBtInt);
    std::__cxx11::string::~string((string *)&heartBtInt);
  }
  else {
    bVar8 = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&heartBtInt,"StartDay",(allocator<char> *)&utcLogonTime);
  local_784 = Dictionary::getDay(settings,(string *)&heartBtInt);
  std::__cxx11::string::~string((string *)&heartBtInt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&heartBtInt,"EndDay",(allocator<char> *)&utcLogonTime);
  uVar11 = Dictionary::getDay(settings,(string *)&heartBtInt);
  std::__cxx11::string::~string((string *)&heartBtInt);
  UtcTimeOnly::UtcTimeOnly(&startTime,0,0,0,0);
  UtcTimeOnly::UtcTimeOnly(&endTime,0,0,0,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&utcLogonTime,"StartTime",(allocator<char> *)&localSessionTime);
  Dictionary::getString((string *)&heartBtInt,settings,(string *)&utcLogonTime,false);
  UtcTimeOnlyConvertor::convert(&utcSessionTime.m_startTime,(string *)&heartBtInt);
  startTime.super_DateTime.m_date = utcSessionTime.m_startTime.super_DateTime.m_date;
  startTime.super_DateTime._12_4_ = utcSessionTime.m_startTime.super_DateTime._12_4_;
  startTime.super_DateTime.m_time = utcSessionTime.m_startTime.super_DateTime.m_time;
  std::__cxx11::string::~string((string *)&heartBtInt);
  std::__cxx11::string::~string((string *)&utcLogonTime);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&utcLogonTime,"EndTime",(allocator<char> *)&localSessionTime);
  Dictionary::getString((string *)&heartBtInt,settings,(string *)&utcLogonTime,false);
  UtcTimeOnlyConvertor::convert(&utcSessionTime.m_startTime,(string *)&heartBtInt);
  endTime.super_DateTime.m_date = utcSessionTime.m_startTime.super_DateTime.m_date;
  endTime.super_DateTime._12_4_ = utcSessionTime.m_startTime.super_DateTime._12_4_;
  endTime.super_DateTime.m_time = utcSessionTime.m_startTime.super_DateTime.m_time;
  std::__cxx11::string::~string((string *)&heartBtInt);
  std::__cxx11::string::~string((string *)&utcLogonTime);
  local_788 = uVar11;
  TimeRange::TimeRange(&utcSessionTime,&startTime,&endTime,local_784,uVar11);
  LocalTimeOnly::LocalTimeOnly
            ((LocalTimeOnly *)&heartBtInt,(int)(startTime.super_DateTime.m_time / 3600000000000),
             (int)((long)((ulong)(uint)((int)(startTime.super_DateTime.m_time / 60000000000) >> 0x1f
                                       ) << 0x20 |
                         startTime.super_DateTime.m_time / 60000000000 & 0xffffffffU) % 0x3c),
             (int)((startTime.super_DateTime.m_time / 1000000000) % 0x3c),0);
  LocalTimeOnly::LocalTimeOnly
            ((LocalTimeOnly *)&utcLogonTime,(int)(endTime.super_DateTime.m_time / 3600000000000),
             (int)((long)((ulong)(uint)((int)(endTime.super_DateTime.m_time / 60000000000) >> 0x1f)
                          << 0x20 | endTime.super_DateTime.m_time / 60000000000 & 0xffffffffU) %
                  0x3c),(int)((endTime.super_DateTime.m_time / 1000000000) % 0x3c),0);
  uVar7 = local_784;
  uVar11 = local_788;
  TimeRange::TimeRange
            (&localSessionTime,(LocalTimeOnly *)&heartBtInt,(LocalTimeOnly *)&utcLogonTime,local_784
             ,local_788);
  pTVar15 = &utcSessionTime;
  if ((char)local_760 != '\0') {
    pTVar15 = &localSessionTime;
  }
  local_578.m_startTime.super_DateTime.m_date = (pTVar15->m_startTime).super_DateTime.m_date;
  local_578.m_startTime.super_DateTime._12_4_ =
       *(undefined4 *)&(pTVar15->m_startTime).super_DateTime.field_0xc;
  local_578.m_startTime.super_DateTime.m_time = (pTVar15->m_startTime).super_DateTime.m_time;
  local_578.m_startTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  local_578.m_endTime.super_DateTime.m_date = (pTVar15->m_endTime).super_DateTime.m_date;
  local_578.m_endTime.super_DateTime._12_4_ =
       *(undefined4 *)&(pTVar15->m_endTime).super_DateTime.field_0xc;
  local_578.m_endTime.super_DateTime.m_time._0_4_ =
       (undefined4)(pTVar15->m_endTime).super_DateTime.m_time;
  local_578.m_endTime.super_DateTime.m_time._4_4_ =
       *(undefined4 *)((long)&(pTVar15->m_endTime).super_DateTime.m_time + 4);
  local_578.m_endTime.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  local_578.m_startDay = pTVar15->m_startDay;
  local_578.m_endDay = pTVar15->m_endDay;
  local_578.m_useLocalTime = pTVar15->m_useLocalTime;
  if ((int)uVar11 < 0 && -1 < (int)uVar7) {
    pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&heartBtInt,"StartDay used without EndDay",(allocator<char> *)&utcLogonTime
              );
    ConfigError::ConfigError(pCVar14,(string *)&heartBtInt);
    __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
  }
  if ((int)uVar7 < 0 && -1 < (int)uVar11) {
    pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&heartBtInt,"EndDay used without StartDay",(allocator<char> *)&utcLogonTime
              );
    ConfigError::ConfigError(pCVar14,(string *)&heartBtInt);
    __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
  }
  if (bVar8 != false) {
    if ((int)(local_788 & uVar7) < 0) {
      UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&heartBtInt,0,0,0,0);
      if ((startTime.super_DateTime.m_date == heartBtInt.super_IntField.super_FieldBase.m_tag) &&
         ((pointer)startTime.super_DateTime.m_time ==
          heartBtInt.super_IntField.super_FieldBase.m_string._M_dataplus._M_p)) {
        UtcTimeOnly::UtcTimeOnly(&utcLogonTime.m_startTime,0,0,0,0);
        if ((endTime.super_DateTime.m_date == utcLogonTime.m_startTime.super_DateTime.m_date) &&
           (endTime.super_DateTime.m_time == utcLogonTime.m_startTime.super_DateTime.m_time))
        goto LAB_001b62dc;
      }
    }
    pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&heartBtInt,"NonStopSession used with StartTime/EndTime/StartDay/EndDay",
               (allocator<char> *)&utcLogonTime);
    ConfigError::ConfigError(pCVar14,(string *)&heartBtInt);
    __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
  }
LAB_001b62dc:
  HeartBtInt::HeartBtInt(&heartBtInt,0);
  bVar9 = std::operator==(&connectionType,"initiator");
  if (bVar9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&localLogonTime,"HeartBtInt",(allocator<char> *)local_7b8);
    iVar12 = Dictionary::getInt(settings,(string *)&localLogonTime);
    HeartBtInt::HeartBtInt((HeartBtInt *)&utcLogonTime,iVar12);
    FieldBase::operator=((FieldBase *)&heartBtInt,(FieldBase *)&utcLogonTime);
    FieldBase::~FieldBase((FieldBase *)&utcLogonTime);
    std::__cxx11::string::~string((string *)&localLogonTime);
    iVar12 = IntField::getValue(&heartBtInt.super_IntField);
    if (iVar12 < 1) {
      pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&utcLogonTime,"Heartbeat must be greater than zero",
                 (allocator<char> *)&localLogonTime);
      ConfigError::ConfigError(pCVar14,(string *)&utcLogonTime);
      __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
    }
  }
  this_00 = (Session *)operator_new(0x878);
  local_5b8._M_unused._M_object = (void *)0x0;
  local_5b8._8_8_ = 0;
  local_5a0 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/SessionFactory.cpp:133:7)>
              ::_M_invoke;
  local_5a8 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/SessionFactory.cpp:133:7)>
              ::_M_manager;
  application = this->m_application;
  messageStoreFactory = this->m_messageStoreFactory;
  iVar12 = IntField::getValue(&heartBtInt.super_IntField);
  Session::Session(this_00,(function<FIX::UtcTimeStamp_()> *)&local_5b8,application,
                   messageStoreFactory,sessionID,&dataDictionaryProvider,&local_578,iVar12,
                   this->m_pLogFactory);
  std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
  std::__cxx11::string::_M_assign((string *)&this_00->m_senderDefaultApplVerID);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&utcLogonTime,"LogonDay",(allocator<char> *)&localLogonTime);
  iVar12 = Dictionary::getDay(settings,(string *)&utcLogonTime);
  std::__cxx11::string::~string((string *)&utcLogonTime);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&utcLogonTime,"LogoutDay",(allocator<char> *)&localLogonTime);
  iVar13 = Dictionary::getDay(settings,(string *)&utcLogonTime);
  std::__cxx11::string::~string((string *)&utcLogonTime);
  local_5f0.m_date = startTime.super_DateTime.m_date;
  local_5f0._12_4_ = startTime.super_DateTime._12_4_;
  local_5f0.m_time = startTime.super_DateTime.m_time;
  local_5f0._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  local_608.m_date = endTime.super_DateTime.m_date;
  local_608._12_4_ = endTime.super_DateTime._12_4_;
  local_608.m_time = endTime.super_DateTime.m_time;
  local_608._vptr_DateTime = (_func_int **)&PTR__DateTime_001fcaa8;
  local_788 = iVar13;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&localLogonTime,"LogonTime",(allocator<char> *)&local_780);
  uVar11 = local_788;
  Dictionary::getString((string *)&utcLogonTime,settings,(string *)&localLogonTime,false);
  UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_7b8,(string *)&utcLogonTime);
  local_5f0._8_8_ = local_7b8._8_8_;
  local_5f0.m_time = local_7b8._16_8_;
  std::__cxx11::string::~string((string *)&utcLogonTime);
  std::__cxx11::string::~string((string *)&localLogonTime);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&localLogonTime,"LogoutTime",(allocator<char> *)&local_780);
  Dictionary::getString((string *)&utcLogonTime,settings,(string *)&localLogonTime,false);
  UtcTimeOnlyConvertor::convert((UtcTimeOnly *)local_7b8,(string *)&utcLogonTime);
  local_608._8_8_ = local_7b8._8_8_;
  local_608.m_time = local_7b8._16_8_;
  std::__cxx11::string::~string((string *)&utcLogonTime);
  std::__cxx11::string::~string((string *)&localLogonTime);
  local_788 = uVar11;
  local_784 = iVar12;
  TimeRange::TimeRange
            (&utcLogonTime,(UtcTimeOnly *)&local_5f0,(UtcTimeOnly *)&local_608,iVar12,uVar11);
  LocalTimeOnly::LocalTimeOnly
            ((LocalTimeOnly *)local_7b8,(int)(local_5f0.m_time / 3600000000000),
             (int)((long)((ulong)(uint)((int)(local_5f0.m_time / 60000000000) >> 0x1f) << 0x20 |
                         local_5f0.m_time / 60000000000 & 0xffffffffU) % 0x3c),
             (int)((local_5f0.m_time / 1000000000) % 0x3c),0);
  LocalTimeOnly::LocalTimeOnly
            ((LocalTimeOnly *)&local_780,(int)(local_608.m_time / 3600000000000),
             (int)((long)((ulong)(uint)((int)(local_608.m_time / 60000000000) >> 0x1f) << 0x20 |
                         local_608.m_time / 60000000000 & 0xffffffffU) % 0x3c),
             (int)((local_608.m_time / 1000000000) % 0x3c),0);
  uVar7 = local_784;
  uVar11 = local_788;
  TimeRange::TimeRange
            (&localLogonTime,(LocalTimeOnly *)local_7b8,(LocalTimeOnly *)&local_780,local_784,
             local_788);
  pTVar15 = &utcLogonTime;
  if ((char)local_760 != '\0') {
    pTVar15 = &localLogonTime;
  }
  iVar12 = (pTVar15->m_startTime).super_DateTime.m_date;
  uVar3 = *(undefined4 *)&(pTVar15->m_startTime).super_DateTime.field_0xc;
  iVar1 = (pTVar15->m_startTime).super_DateTime.m_time;
  iVar13 = (pTVar15->m_endTime).super_DateTime.m_date;
  uVar4 = *(undefined4 *)&(pTVar15->m_endTime).super_DateTime.field_0xc;
  iVar2 = (pTVar15->m_endTime).super_DateTime.m_time;
  iVar5 = pTVar15->m_startDay;
  iVar6 = pTVar15->m_endDay;
  bVar9 = pTVar15->m_useLocalTime;
  bVar10 = TimeRange::isInRange(&local_578,&local_5f0,uVar7);
  if (bVar10) {
    bVar10 = TimeRange::isInRange(&local_578,&local_608,uVar11);
    if (bVar10) {
      (this_00->m_logonTime).m_startTime.super_DateTime.m_date = iVar12;
      *(undefined4 *)&(this_00->m_logonTime).m_startTime.super_DateTime.field_0xc = uVar3;
      (this_00->m_logonTime).m_startTime.super_DateTime.m_time = iVar1;
      (this_00->m_logonTime).m_endTime.super_DateTime.m_date = iVar13;
      *(undefined4 *)&(this_00->m_logonTime).m_endTime.super_DateTime.field_0xc = uVar4;
      (this_00->m_logonTime).m_endTime.super_DateTime.m_time = iVar2;
      (this_00->m_logonTime).m_startDay = iVar5;
      (this_00->m_logonTime).m_endDay = iVar6;
      (this_00->m_logonTime).m_useLocalTime = bVar9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"SendRedundantResendRequests",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"SendRedundantResendRequests",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_sendRedundantResendRequests = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"CheckCompID",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"CheckCompID",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_checkCompId = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"CheckLatency",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"CheckLatency",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_checkLatency = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"MaxLatency",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"MaxLatency",(allocator<char> *)&local_780);
        iVar12 = Dictionary::getInt(settings,(string *)local_7b8);
        this_00->m_maxLatency = iVar12;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"LogonTimeout",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"LogonTimeout",(allocator<char> *)&local_780);
        iVar12 = Dictionary::getInt(settings,(string *)local_7b8);
        (this_00->m_state).m_logonTimeout = iVar12;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"LogoutTimeout",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"LogoutTimeout",(allocator<char> *)&local_780);
        iVar12 = Dictionary::getInt(settings,(string *)local_7b8);
        (this_00->m_state).m_logoutTimeout = iVar12;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"ResetOnLogon",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"ResetOnLogon",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_resetOnLogon = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"ResetOnLogout",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"ResetOnLogout",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_resetOnLogout = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"ResetOnDisconnect",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"ResetOnDisconnect",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_resetOnDisconnect = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"RefreshOnLogon",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"RefreshOnLogon",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_refreshOnLogon = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"MillisecondsInTimeStamp",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"MillisecondsInTimeStamp",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_timestampPrecision = (uint)bVar9 + (uint)bVar9 * 2;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"PersistMessages",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"PersistMessages",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_persistMessages = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"ValidateLengthAndChecksum",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"ValidateLengthAndChecksum",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_validateLengthAndChecksum = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"SendNextExpectedMsgSeqNum",(allocator<char> *)&local_780);
      bVar9 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar9) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_7b8,"SendNextExpectedMsgSeqNum",(allocator<char> *)&local_780);
        bVar9 = Dictionary::getBool(settings,(string *)local_7b8);
        this_00->m_sendNextExpectedMsgSeqNum = bVar9;
        std::__cxx11::string::~string((string *)local_7b8);
      }
      if (bVar8 != false) {
        this_00->m_isNonStopSession = true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_7b8,"AllowedRemoteAddresses",(allocator<char> *)&local_780);
      bVar8 = Dictionary::has(settings,(string *)local_7b8);
      std::__cxx11::string::~string((string *)local_7b8);
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4d0,"AllowedRemoteAddresses",&local_759);
        Dictionary::getString(&local_780,settings,&local_4d0,false);
        string_split((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_7b8,&local_780,',');
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(this_00->m_allowedRemoteAddresses)._M_t,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_7b8);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_7b8);
        std::__cxx11::string::~string((string *)&local_780);
        std::__cxx11::string::~string((string *)&local_4d0);
      }
      FieldBase::~FieldBase((FieldBase *)&heartBtInt);
      DataDictionaryProvider::~DataDictionaryProvider(&dataDictionaryProvider);
      std::__cxx11::string::~string((string *)&defaultApplVerID);
      std::__cxx11::string::~string((string *)&connectionType);
      return this_00;
    }
    pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_7b8,"LogoutTime must be between StartTime and EndTime",
               (allocator<char> *)&local_780);
    ConfigError::ConfigError(pCVar14,(string *)local_7b8);
    __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
  }
  pCVar14 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7b8,"LogonTime must be between StartTime and EndTime",
             (allocator<char> *)&local_780);
  ConfigError::ConfigError(pCVar14,(string *)local_7b8);
  __cxa_throw(pCVar14,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  std::string connectionType = settings.getString(CONNECTION_TYPE);
  if (connectionType != "acceptor" && connectionType != "initiator") {
    throw ConfigError("Invalid ConnectionType");
  }

  if (connectionType == "acceptor" && settings.has(SESSION_QUALIFIER)) {
    throw ConfigError("SessionQualifier cannot be used with acceptor.");
  }

  bool useDataDictionary = true;
  if (settings.has(USE_DATA_DICTIONARY)) {
    useDataDictionary = settings.getBool(USE_DATA_DICTIONARY);
  }

  std::string defaultApplVerID;
  if (sessionID.isFIXT()) {
    if (!settings.has(DEFAULT_APPLVERID)) {
      throw ConfigError("ApplVerID is required for FIXT transport");
    }
    defaultApplVerID = Message::toApplVerID(settings.getString(DEFAULT_APPLVERID));
  }

  DataDictionaryProvider dataDictionaryProvider;
  if (useDataDictionary) {
    if (sessionID.isFIXT()) {
      processFixtDataDictionaries(sessionID, settings, dataDictionaryProvider);
    } else {
      processFixDataDictionary(sessionID, settings, dataDictionaryProvider);
    }
  }

  bool useLocalTime = false;
  if (settings.has(USE_LOCAL_TIME)) {
    useLocalTime = settings.getBool(USE_LOCAL_TIME);
  }

  bool isNonStopSession = false;
  if (settings.has(NON_STOP_SESSION)) {
    isNonStopSession = settings.getBool(NON_STOP_SESSION);
  }

  int startDay = -1;
  int endDay = -1;
  try {
    startDay = settings.getDay(START_DAY);
    endDay = settings.getDay(END_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly startTime = UtcTimeOnly(0, 0, 0);
  UtcTimeOnly endTime = UtcTimeOnly(0, 0, 0);
  try {
    startTime = UtcTimeOnlyConvertor::convert(settings.getString(START_TIME));
    endTime = UtcTimeOnlyConvertor::convert(settings.getString(END_TIME));
  } catch (ConfigError &e) {
    if (!isNonStopSession) {
      throw e;
    }
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcSessionTime(startTime, endTime, startDay, endDay);
  TimeRange localSessionTime(
      LocalTimeOnly(startTime.getHour(), startTime.getMinute(), startTime.getSecond()),
      LocalTimeOnly(endTime.getHour(), endTime.getMinute(), endTime.getSecond()),
      startDay,
      endDay);
  TimeRange sessionTimeRange = useLocalTime ? localSessionTime : utcSessionTime;

  if (startDay >= 0 && endDay < 0) {
    throw ConfigError("StartDay used without EndDay");
  }
  if (endDay >= 0 && startDay < 0) {
    throw ConfigError("EndDay used without StartDay");
  }

  if (isNonStopSession
      && (startDay >= 0 || endDay >= 0 || startTime != UtcTimeOnly(0, 0, 0) || endTime != UtcTimeOnly(0, 0, 0))) {
    throw ConfigError("NonStopSession used with StartTime/EndTime/StartDay/EndDay");
  }

  HeartBtInt heartBtInt(0);
  if (connectionType == "initiator") {
    heartBtInt = HeartBtInt(settings.getInt(HEARTBTINT));
    if (heartBtInt <= 0) {
      throw ConfigError("Heartbeat must be greater than zero");
    }
  }

  std::unique_ptr<Session> pSession;
  pSession.reset(new Session(
      []() { return UtcTimeStamp::now(); },
      m_application,
      m_messageStoreFactory,
      sessionID,
      dataDictionaryProvider,
      sessionTimeRange,
      heartBtInt,
      m_pLogFactory));

  pSession->setSenderDefaultApplVerID(defaultApplVerID);

  int logonDay = startDay;
  int logoutDay = endDay;
  try {
    logonDay = settings.getDay(LOGON_DAY);
    logoutDay = settings.getDay(LOGOUT_DAY);
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  UtcTimeOnly logonTime(startTime);
  UtcTimeOnly logoutTime(endTime);
  try {
    logonTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGON_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  try {
    logoutTime = UtcTimeOnlyConvertor::convert(settings.getString(LOGOUT_TIME));
  } catch (ConfigError &) {
  } catch (FieldConvertError &e) {
    throw ConfigError(e.what());
  }

  TimeRange utcLogonTime(logonTime, logoutTime, logonDay, logoutDay);
  TimeRange localLogonTime(
      LocalTimeOnly(logonTime.getHour(), logonTime.getMinute(), logonTime.getSecond()),
      LocalTimeOnly(logoutTime.getHour(), logoutTime.getMinute(), logoutTime.getSecond()),
      logonDay,
      logoutDay);
  TimeRange logonTimeRange = useLocalTime ? localLogonTime : utcLogonTime;

  if (!sessionTimeRange.isInRange(logonTime, logonDay)) {
    throw ConfigError("LogonTime must be between StartTime and EndTime");
  }
  if (!sessionTimeRange.isInRange(logoutTime, logoutDay)) {
    throw ConfigError("LogoutTime must be between StartTime and EndTime");
  }
  pSession->setLogonTime(logonTimeRange);

  if (settings.has(SEND_REDUNDANT_RESENDREQUESTS)) {
    pSession->setSendRedundantResendRequests(settings.getBool(SEND_REDUNDANT_RESENDREQUESTS));
  }
  if (settings.has(CHECK_COMPID)) {
    pSession->setCheckCompId(settings.getBool(CHECK_COMPID));
  }
  if (settings.has(CHECK_LATENCY)) {
    pSession->setCheckLatency(settings.getBool(CHECK_LATENCY));
  }
  if (settings.has(MAX_LATENCY)) {
    pSession->setMaxLatency(settings.getInt(MAX_LATENCY));
  }
  if (settings.has(LOGON_TIMEOUT)) {
    pSession->setLogonTimeout(settings.getInt(LOGON_TIMEOUT));
  }
  if (settings.has(LOGOUT_TIMEOUT)) {
    pSession->setLogoutTimeout(settings.getInt(LOGOUT_TIMEOUT));
  }
  if (settings.has(RESET_ON_LOGON)) {
    pSession->setResetOnLogon(settings.getBool(RESET_ON_LOGON));
  }
  if (settings.has(RESET_ON_LOGOUT)) {
    pSession->setResetOnLogout(settings.getBool(RESET_ON_LOGOUT));
  }
  if (settings.has(RESET_ON_DISCONNECT)) {
    pSession->setResetOnDisconnect(settings.getBool(RESET_ON_DISCONNECT));
  }
  if (settings.has(REFRESH_ON_LOGON)) {
    pSession->setRefreshOnLogon(settings.getBool(REFRESH_ON_LOGON));
  }
  if (settings.has(MILLISECONDS_IN_TIMESTAMP)) {
    pSession->setMillisecondsInTimeStamp(settings.getBool(MILLISECONDS_IN_TIMESTAMP));
  }
  if (settings.has(PERSIST_MESSAGES)) {
    pSession->setPersistMessages(settings.getBool(PERSIST_MESSAGES));
  }
  if (settings.has(VALIDATE_LENGTH_AND_CHECKSUM)) {
    pSession->setValidateLengthAndChecksum(settings.getBool(VALIDATE_LENGTH_AND_CHECKSUM));
  }
  if (settings.has(SEND_NEXT_EXPECTED_MSG_SEQ_NUM)) {
    pSession->setSendNextExpectedMsgSeqNum(settings.getBool(SEND_NEXT_EXPECTED_MSG_SEQ_NUM));
  }
  if (isNonStopSession) {
    pSession->setIsNonStopSession(isNonStopSession);
  }
  if (settings.has(ALLOWED_REMOTE_ADDRESSES)) {
    pSession->setAllowedRemoteAddresses(string_split(settings.getString(ALLOWED_REMOTE_ADDRESSES), ','));
  }

  return pSession.release();
}